

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     ,u8 *pEstWidth)

{
  u8 uVar1;
  short sVar2;
  SrcList *pSVar3;
  Schema *pSchema;
  sqlite3 *db;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  undefined8 *puVar8;
  Expr *pExpr_00;
  long lVar9;
  undefined8 *puVar10;
  u8 estWidth;
  char *zOrigTab;
  char *zOrigDb;
  NameContext sNC;
  u8 local_a1;
  char *local_a0;
  char *local_98;
  char *local_90;
  char **local_88;
  long local_80;
  char *local_78;
  char **local_70;
  NameContext local_68;
  
  local_90 = (char *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  local_a1 = '\x01';
  uVar1 = pExpr->op;
  if (uVar1 == 'w') {
    local_68.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_00258f07:
    local_68.pParse = pNC->pParse;
    local_68.pNext = pNC;
    pcVar7 = columnTypeImpl(&local_68,pExpr_00,&local_90,&local_98,&local_a0,&local_a1);
  }
  else {
    if ((uVar1 == 0x9a) || (uVar1 == 0x98)) {
      sVar2 = pExpr->iColumn;
      uVar5 = (uint)sVar2;
      puVar8 = (undefined8 *)0x0;
LAB_00258e7b:
      puVar10 = (undefined8 *)0x0;
      while ((pNC != (NameContext *)0x0 && (puVar10 == (undefined8 *)0x0))) {
        pSVar3 = pNC->pSrcList;
        uVar4 = pSVar3->nSrc;
        if (pSVar3->nSrc < 1) {
          uVar4 = 0;
        }
        lVar9 = 0;
        while( true ) {
          if ((ulong)uVar4 * 0x70 - lVar9 == 0) {
            pNC = pNC->pNext;
            goto LAB_00258e7b;
          }
          if (*(int *)((long)&pSVar3->a[0].iCursor + lVar9) == pExpr->iTable) break;
          lVar9 = lVar9 + 0x70;
        }
        puVar8 = *(undefined8 **)((long)&pSVar3->a[0].pSelect + lVar9);
        puVar10 = *(undefined8 **)((long)&pSVar3->a[0].pTab + lVar9);
      }
      if (puVar10 != (undefined8 *)0x0) {
        if (puVar8 == (undefined8 *)0x0) {
          pSchema = (Schema *)puVar10[0xe];
          if (pSchema != (Schema *)0x0) {
            if (sVar2 < 0) {
              uVar5 = (uint)*(short *)((long)puVar10 + 0x44);
            }
            local_88 = pzOrigTab;
            if ((int)uVar5 < 0) {
              pcVar7 = "INTEGER";
              local_a0 = "rowid";
            }
            else {
              local_80 = puVar10[1];
              lVar9 = (ulong)uVar5 * 0x20;
              local_78 = *(char **)(local_80 + lVar9);
              local_70 = pzOrigCol;
              pcVar7 = sqlite3ColumnType((Column *)(local_80 + lVar9),(char *)0x0);
              local_a1 = *(u8 *)(local_80 + 0x1a + lVar9);
              local_a0 = local_78;
              pzOrigCol = local_70;
            }
            local_98 = (char *)*puVar10;
            pzOrigTab = local_88;
            if (pNC->pParse != (Parse *)0x0) {
              db = pNC->pParse->db;
              iVar6 = sqlite3SchemaToIndex(db,pSchema);
              local_90 = db->aDb[iVar6].zDbSName;
              pzOrigTab = local_88;
            }
            goto LAB_00258fad;
          }
        }
        else if ((-1 < sVar2) && ((int)uVar5 < *(int *)*puVar8)) {
          pExpr_00 = *(Expr **)((int *)*puVar8 + (ulong)uVar5 * 8 + 2);
          local_68.pSrcList = (SrcList *)puVar8[4];
          goto LAB_00258f07;
        }
      }
    }
    pcVar7 = (char *)0x0;
  }
LAB_00258fad:
  if (pzOrigDb != (char **)0x0) {
    *pzOrigDb = local_90;
    *pzOrigTab = local_98;
    *pzOrigCol = local_a0;
  }
  if (pEstWidth != (u8 *)0x0) {
    *pEstWidth = local_a1;
  }
  return pcVar7;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
  Expr *pExpr,
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol,
#endif
  u8 *pEstWidth
){
  char const *zType = 0;
  int j;
  u8 estWidth = 1;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol, &estWidth); 
        }
      }else if( pTab->pSchema ){
        /* A real table */
        assert( !pS );
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol, &estWidth); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  if( pEstWidth ) *pEstWidth = estWidth;
  return zType;
}